

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::removeSecondColumnSingletonInDoubletonRow(HPresolve *this,int j,int i)

{
  int *piVar1;
  iterator *piVar2;
  double dVar3;
  double dVar4;
  pointer piVar5;
  pointer pdVar6;
  _Elt_pointer pcVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  int local_28;
  change local_24;
  
  piVar5 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_28 = j;
  if ((ulong)((long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2) <= (ulong)(long)i
     ) {
LAB_00142428:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  piVar5[i] = 0;
  uVar10 = (ulong)j;
  pdVar6 = (this->super_HPreData).colCost.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->super_HPreData).colCost.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10)
  goto LAB_00142428;
  dVar12 = pdVar6[uVar10];
  if (dVar12 <= 0.0) {
    pdVar6 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)(this->super_HPreData).colUpper.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
    if (0.0 <= dVar12) {
      if (uVar9 <= uVar10) goto LAB_00142428;
      dVar3 = pdVar6[uVar10];
      if (0.0 <= dVar3) {
        pdVar6 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).colLower.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10)
        goto LAB_00142428;
        dVar12 = 0.0;
        if (pdVar6[uVar10] <= 0.0) goto LAB_00142346;
      }
      pdVar6 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_HPreData).colLower.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10)
      goto LAB_00142428;
      dVar4 = pdVar6[uVar10];
      dVar12 = dVar3;
      if (ABS(dVar4) <= ABS(dVar3)) {
        dVar12 = dVar4;
      }
      goto LAB_00142346;
    }
    if (uVar9 <= uVar10) goto LAB_00142428;
    dVar12 = pdVar6[uVar10];
    bVar11 = dVar12 == 1e+200;
  }
  else {
    pdVar6 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_HPreData).colLower.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10)
    goto LAB_00142428;
    dVar12 = pdVar6[uVar10];
    bVar11 = dVar12 == -1e+200;
  }
  if ((bVar11) && (!NAN(dVar12))) {
    if (0 < this->iPrint) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"PR: Problem unbounded.",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    this->status = 2;
    return;
  }
LAB_00142346:
  setPrimalValue(this,j,dVar12);
  local_24.type = 0x14;
  local_24.row = 0;
  local_24.col = local_28;
  pcVar7 = (this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pcVar7 == *(_Elt_pointer *)
                 ((long)&(this->super_HPreData).chng.c.
                         super__Deque_base<change,_std::allocator<change>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x10) + -1) {
    std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
              ((deque<change,std::allocator<change>> *)&(this->super_HPreData).chng,&local_24);
  }
  else {
    pcVar7->col = local_28;
    pcVar7->type = 0x14;
    pcVar7->row = 0;
    piVar2 = &(this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar2->_M_cur = piVar2->_M_cur + 1;
  }
  if (0 < this->iPrint) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Second singleton column ",0x1c);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," in doubleton row ",0x12);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,i);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," removed.\n",10);
  }
  piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 8;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::list<int,_std::allocator<int>_>::remove(&this->singCol,(char *)&local_28);
  return;
}

Assistant:

void HPresolve::removeSecondColumnSingletonInDoubletonRow(const int j, const int i) {
	// case two singleton columns
	// when we get here bounds on xj are updated so we can choose low/upper one
	// depending on the cost of xj
	flagRow.at(i) = 0;
	double value;
	if (colCost.at(j) > 0) {
		if (colLower.at(j) == -HSOL_CONST_INF) {
			if (iPrint > 0)
				cout << "PR: Problem unbounded." << endl;
			status = Unbounded;
			return;
		}
		value = colLower.at(j);
	} else if (colCost.at(j) < 0) {
		if (colUpper.at(j) == HSOL_CONST_INF) {
			if (iPrint > 0)
				cout << "PR: Problem unbounded." << endl;
			status = Unbounded;
			return;
		}
		value = colUpper.at(j);
	} else { //(colCost.at(j) == 0)
		if (colUpper.at(j) >= 0 && colLower.at(j) <= 0)
			value = 0;
		else if (abs(colUpper.at(j)) < abs(colLower.at(j)))
			value = colUpper.at(j);
		else
			value = colLower.at(j);
	}
	setPrimalValue(j, value);
	addChange(SING_COL_DOUBLETON_INEQ_SECOND_SING_COL, 0, j);
	if (iPrint > 0)
		cout << "PR: Second singleton column " << j << " in doubleton row " << i
				<< " removed.\n";
	countRemovedCols[SING_COL_DOUBLETON_INEQ]++;
	singCol.remove(j);
}